

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O0

iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::operator()
          (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                End)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  It2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  It;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [5];
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  local_10;
  
  first._M_current = &stack0xffffffffffffffa8;
  is_any_ofF<char>::is_any_ofF
            ((is_any_ofF<char> *)first._M_current,(is_any_ofF<char> *)in_RDI._M_current);
  _Var2 = std::
          find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::algorithm::detail::is_any_ofF<char>>
                    (in_stack_ffffffffffffffb8,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )in_stack_ffffffffffffffb0,(is_any_ofF<char> *)in_stack_ffffffffffffffa8);
  is_any_ofF<char>::~is_any_ofF
            ((is_any_ofF<char> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  if (bVar1) {
    iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
    iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),first,in_RDI);
  }
  else {
    local_80[0] = _Var2;
    if (*(int *)(in_RDI._M_current + 0x18) == 0) {
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff57 = false;
        if (bVar1) {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(local_80);
          in_stack_ffffffffffffff57 =
               is_any_ofF<char>::operator()
                         ((is_any_ofF<char> *)first._M_current,
                          (char)((ulong)in_RDI._M_current >> 0x38));
        }
        if ((bool)in_stack_ffffffffffffff57 == false) break;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_80);
      }
      in_stack_ffffffffffffff57 = 0;
    }
    else {
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_80);
    }
    iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>::
    iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),first,in_RDI);
  }
  return (iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
            )local_10.
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  ;
}

Assistant:

iterator_range<ForwardIteratorT>
                operator()(
                    ForwardIteratorT Begin,
                    ForwardIteratorT End ) const
                {
                    typedef iterator_range<ForwardIteratorT> result_type;

                    ForwardIteratorT It=std::find_if( Begin, End, m_Pred );

                    if( It==End )
                    {
                        return result_type( End, End );
                    }
                    else
                    {
                        ForwardIteratorT It2=It;

                        if( m_eCompress==token_compress_on )
                        {
                            // Find first non-matching character
                            while( It2!=End && m_Pred(*It2) ) ++It2;
                        }
                        else
                        {
                            // Advance by one position
                            ++It2;
                        }

                        return result_type( It, It2 );
                    }
                }